

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O0

void __thiscall spvtools::opt::CFG::ForgetBlock(CFG *this,BasicBlock *blk)

{
  uint32_t local_20;
  uint32_t local_1c;
  BasicBlock *local_18;
  BasicBlock *blk_local;
  CFG *this_local;
  
  local_18 = blk;
  blk_local = (BasicBlock *)this;
  local_1c = BasicBlock::id(blk);
  std::
  unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
  ::erase(&this->id2block_,&local_1c);
  local_20 = BasicBlock::id(local_18);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::erase(&this->label2preds_,&local_20);
  RemoveSuccessorEdges(this,local_18);
  return;
}

Assistant:

void ForgetBlock(const BasicBlock* blk) {
    id2block_.erase(blk->id());
    label2preds_.erase(blk->id());
    RemoveSuccessorEdges(blk);
  }